

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O1

ReturnCode ungetstring(Global *global,char *text)

{
  ReturnCode RVar1;
  size_t sVar2;
  FILEINFO *file;
  FILEINFO *local_20;
  
  sVar2 = strlen(text);
  RVar1 = getfile(global,sVar2 + 1,"",&local_20);
  if (RVar1 == FPP_OK) {
    strcpy(local_20->buffer,text);
  }
  return RVar1;
}

Assistant:

ReturnCode ungetstring(struct Global *global, char *text)
{
  /*
   * Push a string back on the input stream.  This is done by treating
   * the text as if it were a macro.
   */

  FILEINFO *file;
  ReturnCode ret;
  
  ret = getfile(global, strlen(text) + 1, "", &file);
  if(!ret)
    strcpy(file->buffer, text);
  return(ret);
}